

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_noncentral_absolute_pose_sac.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer piVar1;
  MultiNoncentralAbsolutePoseSacProblem *this;
  ostream *poVar2;
  long lVar3;
  pointer pvVar4;
  ulong uVar5;
  size_t j;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar10;
  undefined1 auVar9 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar11;
  timeval tVar12;
  shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
  absposeproblem_ptr;
  rotations_t camRotations;
  translations_t camOffsets;
  timeval tic;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiPoints;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  gt;
  timeval toc;
  translation_t position;
  rotation_t rotation;
  NoncentralAbsoluteMultiAdapter adapter;
  __shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
  local_370;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_360;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_340;
  timeval local_320;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_310;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_2f0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_2d0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_2b8;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_2a0;
  timeval local_288;
  Vector3d local_278;
  undefined1 local_260 [128];
  pointer local_1e0;
  pointer pvStack_1d8;
  pointer pvStack_1d0;
  pointer pvStack_1c8;
  pointer pvStack_1c0;
  pointer pvStack_1b8;
  __shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
  a_Stack_1b0 [2];
  Matrix3d local_190;
  NoncentralAbsoluteMultiAdapter local_148;
  
  opengv::initializeRandomSeed();
  opengv::generateRandomTranslation(&local_278,2.0);
  opengv::generateRandomRotation(&local_190,0.5);
  local_340._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_340._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_360._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateRandomCameraSystem(4,(translations_t *)&local_340,(rotations_t *)&local_360);
  local_2f0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_310.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateMulti2D3DCorrespondences
            (&local_278,&local_190,(translations_t *)&local_340,(rotations_t *)&local_360,0x19,0.5,
             0.1,&local_2f0,&local_310,&local_2a0);
  opengv::printExperimentCharacteristics(&local_278,&local_190,0.5,0.1);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_2b8,&local_310);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_2d0,&local_2f0);
  opengv::absolute_pose::NoncentralAbsoluteMultiAdapter::NoncentralAbsoluteMultiAdapter
            (&local_148,&local_2b8,&local_2d0,(translations_t *)&local_340,(rotations_t *)&local_360
            );
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_2d0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_2b8);
  local_260._8_4_ = 1000;
  local_260._16_8_ = 1.0;
  local_260._24_8_ = 0.99;
  local_1e0 = (pointer)0x0;
  pvStack_1d8 = (pointer)0x0;
  pvStack_1d0 = (pointer)0x0;
  pvStack_1c8 = (pointer)0x0;
  pvStack_1c0 = (pointer)0x0;
  pvStack_1b8 = (pointer)0x0;
  a_Stack_1b0[0]._M_ptr = (element_type *)0x0;
  a_Stack_1b0[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_260._0_8_ = &PTR__MultiSampleConsensus_002d69c8;
  this = (MultiNoncentralAbsolutePoseSacProblem *)operator_new(0x13f0);
  opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem::
  MultiNoncentralAbsolutePoseSacProblem(this,&local_148.super_AbsoluteMultiAdapterBase,false);
  std::
  __shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,void>
            ((__shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,(__gnu_cxx::_Lock_policy)2>
              *)&local_370,this);
  std::
  __shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(a_Stack_1b0,&local_370);
  local_260._16_8_ = 3.9062477108497973e-07;
  local_260._8_4_ = 0x32;
  gettimeofday(&local_320,(__timezone_ptr_t)0x0);
  opengv::sac::
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  computeModel((MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
                *)local_260,0);
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  tVar11 = timeval_minus((timeval *)&local_288,(timeval *)&local_320);
  tVar12 = timeval_minus((timeval *)&local_288,(timeval *)&local_320);
  poVar2 = std::operator<<((ostream *)&std::cout,"the ransac results is: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)(local_260 + 0x20))
  ;
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Ransac needed ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_260._12_4_);
  uVar10 = extraout_XMM1_Qb;
  std::operator<<(poVar2," iterations and ");
  auVar9._0_8_ = (double)tVar11.tv_sec;
  auVar9._8_8_ = uVar10;
  auVar8._0_8_ = (double)tVar12.tv_usec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8 = vfmadd132sd_fma(auVar8,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar2 = std::ostream::_M_insert<double>(auVar8._0_8_);
  poVar2 = std::operator<<(poVar2," seconds");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = ((long)pvStack_1c0 - (long)pvStack_1c8) / 0x18;
  do {
    bVar7 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar7);
  poVar2 = std::operator<<((ostream *)&std::cout,"the number of inliers is: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"the found inliers are: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pvVar4 = pvStack_1c8;
  for (uVar5 = 0; uVar5 < (ulong)(((long)pvStack_1c0 - (long)pvVar4) / 0x18); uVar5 = uVar5 + 1) {
    for (uVar6 = 0;
        piVar1 = pvVar4[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)pvVar4[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar6 = uVar6 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar1[uVar6]);
      std::operator<<(poVar2," ");
      pvVar4 = pvStack_1c8;
    }
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_370._M_refcount);
  opengv::sac::
  MultiSampleConsensus<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  ~MultiSampleConsensus
            ((MultiSampleConsensus<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
              *)local_260);
  opengv::absolute_pose::NoncentralAbsoluteMultiAdapter::~NoncentralAbsoluteMultiAdapter(&local_148)
  ;
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~vector(&local_2a0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_310);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_2f0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_360);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_340);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.1;
  size_t pointsPerCam = 25;
  int numberCameras = 4;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);

  //create a random camera-system
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  std::vector<std::shared_ptr<points_t> > multiPoints;
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors;
  std::vector< std::shared_ptr<Eigen::MatrixXd> > gt;
  generateMulti2D3DCorrespondences(
      position, rotation, camOffsets, camRotations,
      pointsPerCam, noise, outlierFraction,
      multiPoints, multiBearingVectors, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a non-central absolute adapter
  absolute_pose::NoncentralAbsoluteMultiAdapter adapter(
      multiBearingVectors,
      multiPoints,
      camOffsets,
      camRotations );

  //Create a AbsolutePoseSacProblem and Ransac
  //The method is set to GP3P
  sac::MultiRansac<
      sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> ransac;
  std::shared_ptr<
      sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> absposeproblem_ptr(
      new sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem(
      adapter ));

  ransac.sac_model_ = absposeproblem_ptr;
  ransac.threshold_ = 1.0 - cos(atan(sqrt(2.0)*0.5/800.0));
  ransac.max_iterations_ = 50;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //print the results
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_ << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  size_t numberInliers = 0;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    numberInliers += ransac.inliers_[i].size();
  std::cout << "the number of inliers is: " << numberInliers;
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
  {
    for(size_t j = 0; j < ransac.inliers_[i].size(); j++)
      std::cout << ransac.inliers_[i][j] << " ";
  }
  std::cout << std::endl << std::endl;
}